

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeNaN.cpp
# Opt level: O1

void __thiscall wasm::DeNaN::visitFunction(DeNaN *this,Function *func)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *pcVar1;
  PassRunner *pPVar2;
  Module *wasm;
  size_t sVar3;
  Type TVar4;
  Expression *pEVar5;
  Block *pBVar6;
  Expression **__args;
  Id index;
  ulong uVar7;
  MixedArena *pMVar8;
  initializer_list<wasm::Expression_*> __l;
  initializer_list<wasm::Expression_*> __l_00;
  PassOptions local_268;
  undefined1 local_1c0 [8];
  PassRunner runner;
  __node_base local_98 [2];
  DeNaN *local_88;
  Function *local_80;
  size_t local_78;
  Expression *local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> fixes;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
  local_48;
  __alloc_node_gen_t __alloc_node_gen;
  Builder builder;
  
  if ((func->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
    __alloc_node_gen._M_h =
         (__hashtable_alloc *)
         (this->
         super_WalkerPass<wasm::ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>_>
         ).super_ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.
         super_PostWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.
         super_Walker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.currModule;
    auStack_68 = (undefined1  [8])0x0;
    fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar3 = Function::getNumParams(func);
    if (sVar3 != 0) {
      uVar7 = 0;
      local_88 = this;
      local_80 = func;
      local_78 = sVar3;
      do {
        index = (Id)uVar7;
        TVar4 = Function::getLocalType(func,index);
        if (TVar4.id == 4) {
          sVar3 = (this->deNan32).super_IString.str._M_len;
          pcVar1 = (this->deNan32).super_IString.str._M_str;
          local_70 = (Expression *)
                     MixedArena::allocSpace((MixedArena *)(__alloc_node_gen._M_h + 0x158),0x18,8);
          local_70->_id = LocalGetId;
          local_70[1]._id = index;
          (local_70->type).id = 4;
          __l._M_len = 1;
          __l._M_array = &local_70;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1c0,
                     __l,(allocator_type *)((long)&builder.wasm + 7));
          pMVar8 = (MixedArena *)(__alloc_node_gen._M_h + 0x158);
          pEVar5 = (Expression *)MixedArena::allocSpace(pMVar8,0x48,8);
          pEVar5->_id = CallId;
          (pEVar5->type).id = 0;
          *(undefined8 *)(pEVar5 + 1) = 0;
          pEVar5[1].type.id = 0;
          *(undefined8 *)(pEVar5 + 2) = 0;
          pEVar5[2].type.id = (uintptr_t)pMVar8;
          *(undefined8 *)(pEVar5 + 3) = 0;
          pEVar5[3].type.id = 0;
          *(undefined1 *)&pEVar5[4]._id = InvalidId;
          (pEVar5->type).id = 4;
          *(size_t *)(pEVar5 + 3) = sVar3;
          pEVar5[3].type.id = (uintptr_t)pcVar1;
          ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
          set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                    ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)
                     (pEVar5 + 1),
                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1c0);
          *(undefined1 *)&pEVar5[4]._id = InvalidId;
          local_48._M_h =
               (__hashtable_alloc *)Builder::makeLocalSet((Builder *)&__alloc_node_gen,index,pEVar5)
          ;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                     (Expression **)&local_48);
          func = local_80;
          this = local_88;
          sVar3 = local_78;
          if (local_1c0 != (undefined1  [8])0x0) {
            operator_delete((void *)local_1c0,(long)runner.wasm - (long)local_1c0);
            sVar3 = local_78;
          }
        }
        else {
          TVar4 = Function::getLocalType(func,index);
          if (TVar4.id == 5) {
            sVar3 = (this->deNan64).super_IString.str._M_len;
            pcVar1 = (this->deNan64).super_IString.str._M_str;
            local_70 = (Expression *)
                       MixedArena::allocSpace((MixedArena *)(__alloc_node_gen._M_h + 0x158),0x18,8);
            local_70->_id = LocalGetId;
            local_70[1]._id = index;
            (local_70->type).id = 5;
            __l_00._M_len = 1;
            __l_00._M_array = &local_70;
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1c0,
                       __l_00,(allocator_type *)((long)&builder.wasm + 7));
            pMVar8 = (MixedArena *)(__alloc_node_gen._M_h + 0x158);
            pEVar5 = (Expression *)MixedArena::allocSpace(pMVar8,0x48,8);
            pEVar5->_id = CallId;
            (pEVar5->type).id = 0;
            *(undefined8 *)(pEVar5 + 1) = 0;
            pEVar5[1].type.id = 0;
            *(undefined8 *)(pEVar5 + 2) = 0;
            pEVar5[2].type.id = (uintptr_t)pMVar8;
            *(undefined8 *)(pEVar5 + 3) = 0;
            pEVar5[3].type.id = 0;
            *(undefined1 *)&pEVar5[4]._id = InvalidId;
            (pEVar5->type).id = 5;
            *(size_t *)(pEVar5 + 3) = sVar3;
            pEVar5[3].type.id = (uintptr_t)pcVar1;
            ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
            set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                      ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)
                       (pEVar5 + 1),
                       (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1c0)
            ;
            *(undefined1 *)&pEVar5[4]._id = InvalidId;
            local_48._M_h =
                 (__hashtable_alloc *)
                 Builder::makeLocalSet((Builder *)&__alloc_node_gen,index,pEVar5);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                       (Expression **)&local_48);
            this = local_88;
            func = local_80;
            sVar3 = local_78;
            if (local_1c0 != (undefined1  [8])0x0) {
              operator_delete((void *)local_1c0,(long)runner.wasm - (long)local_1c0);
              func = local_80;
              sVar3 = local_78;
            }
          }
        }
        uVar7 = (ulong)(index + BlockId);
      } while (uVar7 < sVar3);
    }
    if (auStack_68 !=
        (undefined1  [8])
        fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      __args = &func->body;
      if (fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                   (iterator)
                   fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,__args);
      }
      else {
        *fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
         super__Vector_impl_data._M_start = *__args;
        fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      pBVar6 = Builder::
               makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                         ((Builder *)&__alloc_node_gen,
                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          auStack_68);
      *__args = (Expression *)pBVar6;
      pPVar2 = (this->
               super_WalkerPass<wasm::ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>_>
               ).super_Pass.runner;
      wasm = (this->
             super_WalkerPass<wasm::ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>_>
             ).
             super_ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>
             .super_PostWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.
             super_Walker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.
             currModule;
      local_268.ignoreImplicitTraps = (pPVar2->options).ignoreImplicitTraps;
      local_268.trapsNeverHappen = (pPVar2->options).trapsNeverHappen;
      local_268.lowMemoryUnused = (pPVar2->options).lowMemoryUnused;
      local_268.fastMath = (pPVar2->options).fastMath;
      local_268.zeroFilledMemory = (pPVar2->options).zeroFilledMemory;
      local_268.closedWorld = (pPVar2->options).closedWorld;
      local_268.debugInfo = (pPVar2->options).debugInfo;
      local_268.targetJS = (pPVar2->options).targetJS;
      this_00 = &local_268.arguments;
      local_268.debug = (pPVar2->options).debug;
      local_268.validate = (pPVar2->options).validate;
      local_268.validateGlobally = (pPVar2->options).validateGlobally;
      local_268._3_1_ = (pPVar2->options).field_0x3;
      local_268.optimizeLevel = (pPVar2->options).optimizeLevel;
      local_268.shrinkLevel = (pPVar2->options).shrinkLevel;
      local_268.inlining.alwaysInlineMaxSize = (pPVar2->options).inlining.alwaysInlineMaxSize;
      local_268.inlining.oneCallerInlineMaxSize = (pPVar2->options).inlining.oneCallerInlineMaxSize;
      local_268.inlining.flexibleInlineMaxSize = (pPVar2->options).inlining.flexibleInlineMaxSize;
      local_268.inlining.allowFunctionsWithLoops =
           (pPVar2->options).inlining.allowFunctionsWithLoops;
      local_268.inlining._13_3_ = *(undefined3 *)&(pPVar2->options).inlining.field_0xd;
      local_268.inlining.partialInliningIfs = (pPVar2->options).inlining.partialInliningIfs;
      local_268.arguments._M_h._M_buckets = (__buckets_ptr)0x0;
      local_268.arguments._M_h._M_bucket_count = (pPVar2->options).arguments._M_h._M_bucket_count;
      local_268.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_268.arguments._M_h._M_element_count = (pPVar2->options).arguments._M_h._M_element_count;
      local_268.arguments._M_h._M_rehash_policy._M_max_load_factor =
           (pPVar2->options).arguments._M_h._M_rehash_policy._M_max_load_factor;
      local_268.arguments._M_h._M_rehash_policy._4_4_ =
           *(undefined4 *)&(pPVar2->options).arguments._M_h._M_rehash_policy.field_0x4;
      local_268.arguments._M_h._M_rehash_policy._M_next_resize =
           (pPVar2->options).arguments._M_h._M_rehash_policy._M_next_resize;
      local_268.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_48._M_h = (__hashtable_alloc *)this_00;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this_00,&(pPVar2->options).arguments._M_h,&local_48);
      this_01 = &local_268.passesToSkip;
      local_268.passesToSkip._M_h._M_buckets = (__buckets_ptr)0x0;
      local_268.passesToSkip._M_h._M_bucket_count =
           (pPVar2->options).passesToSkip._M_h._M_bucket_count;
      local_268.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_268.passesToSkip._M_h._M_element_count =
           (pPVar2->options).passesToSkip._M_h._M_element_count;
      local_268.passesToSkip._M_h._M_rehash_policy._M_max_load_factor =
           (pPVar2->options).passesToSkip._M_h._M_rehash_policy._M_max_load_factor;
      local_268.passesToSkip._M_h._M_rehash_policy._4_4_ =
           *(undefined4 *)&(pPVar2->options).passesToSkip._M_h._M_rehash_policy.field_0x4;
      local_268.passesToSkip._M_h._M_rehash_policy._M_next_resize =
           (pPVar2->options).passesToSkip._M_h._M_rehash_policy._M_next_resize;
      local_268.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_48._M_h = (__hashtable_alloc *)this_01;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)this_01,&(pPVar2->options).passesToSkip._M_h,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                  *)&local_48);
      local_268.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (pPVar2->options).funcEffectsMap.
                super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_268.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (pPVar2->options).funcEffectsMap.
           super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_268.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_268.funcEffectsMap.
           super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_268.funcEffectsMap.
                super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_268.funcEffectsMap.
           super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_268.funcEffectsMap.
                super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      PassRunner::PassRunner((PassRunner *)local_1c0,wasm,&local_268);
      if (local_268.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_268.funcEffectsMap.
                   super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&this_01->_M_h);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&this_00->_M_h);
      runner.options.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_1_ = 1;
      runner.skippedPasses._M_h._M_single_bucket = local_98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&runner.skippedPasses._M_h._M_single_bucket,"merge-blocks","");
      PassRunner::add((PassRunner *)local_1c0,(string *)&runner.skippedPasses._M_h._M_single_bucket)
      ;
      if (runner.skippedPasses._M_h._M_single_bucket != local_98) {
        operator_delete(runner.skippedPasses._M_h._M_single_bucket,
                        (ulong)((long)&(local_98[0]._M_nxt)->_M_nxt + 1));
      }
      PassRunner::run((PassRunner *)local_1c0);
      PassRunner::~PassRunner((PassRunner *)local_1c0);
    }
    if (auStack_68 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_68,
                      (long)fixes.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
    }
  }
  return;
}

Assistant:

void visitFunction(Function* func) {
    if (func->imported()) {
      return;
    }
    // Instrument all locals as they enter the function.
    Builder builder(*getModule());
    std::vector<Expression*> fixes;
    auto num = func->getNumParams();
    for (Index i = 0; i < num; i++) {
      if (func->getLocalType(i) == Type::f32) {
        fixes.push_back(builder.makeLocalSet(
          i,
          builder.makeCall(
            deNan32, {builder.makeLocalGet(i, Type::f32)}, Type::f32)));
      } else if (func->getLocalType(i) == Type::f64) {
        fixes.push_back(builder.makeLocalSet(
          i,
          builder.makeCall(
            deNan64, {builder.makeLocalGet(i, Type::f64)}, Type::f64)));
      }
    }
    if (!fixes.empty()) {
      fixes.push_back(func->body);
      func->body = builder.makeBlock(fixes);
      // Merge blocks so we don't add an unnecessary one.
      PassRunner runner(getModule(), getPassOptions());
      runner.setIsNested(true);
      runner.add("merge-blocks");
      runner.run();
    }
  }